

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cSparseTextureClampTests.cpp
# Opt level: O2

int __thiscall
gl4cts::SparseTextureClampLookupColorTestCase::init
          (SparseTextureClampLookupColorTestCase *this,EVP_PKEY_CTX *ctx)

{
  vector<int,_std::allocator<int>_> *this_00;
  set<int,_std::less<int>,_std::allocator<int>_> *this_01;
  int extraout_EAX;
  vector<gl4cts::SparseTexture2LookupTestCase::FunctionToken,_std::allocator<gl4cts::SparseTexture2LookupTestCase::FunctionToken>_>
  *this_02;
  FunctionToken f;
  allocator<char> local_2fa;
  allocator<char> local_2f9;
  FunctionToken local_2f8;
  FunctionToken local_288;
  string local_218;
  string local_1f8;
  string local_1d8;
  string local_1b8;
  string local_198;
  string local_178;
  string local_158;
  string local_138;
  string local_118;
  string local_f8;
  string local_d8;
  string local_b8;
  string local_98;
  string local_78;
  string local_58;
  string local_38;
  
  SparseTextureCommitmentTestCase::init((SparseTextureCommitmentTestCase *)this,ctx);
  this_00 = &(this->super_SparseTextureClampLookupResidencyTestCase).
             super_SparseTexture2LookupTestCase.super_SparseTexture2CommitmentTestCase.
             super_SparseTextureCommitmentTestCase.mSupportedTargets;
  local_288.name._M_dataplus._M_p._0_4_ = 0xde0;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(this_00,(int *)&local_288);
  local_288.name._M_dataplus._M_p._0_4_ = 0x8c18;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(this_00,(int *)&local_288);
  local_288.name._M_dataplus._M_p._0_4_ = 0x81a5;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>
            (&(this->super_SparseTextureClampLookupResidencyTestCase).
              super_SparseTexture2LookupTestCase.super_SparseTexture2CommitmentTestCase.
              super_SparseTextureCommitmentTestCase.mSupportedInternalFormats,(int *)&local_288);
  local_288.name._M_dataplus._M_p = (pointer)&local_288.name.field_2;
  local_288.name._M_string_length = 0;
  local_288.name.field_2._M_local_buf[0] = '\0';
  local_288.arguments._M_dataplus._M_p = (pointer)&local_288.arguments.field_2;
  local_288.arguments._M_string_length = 0;
  local_288.arguments.field_2._M_local_buf[0] = '\0';
  local_288.allowedTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_288.allowedTargets._M_t._M_impl.super__Rb_tree_header._M_header;
  local_288.allowedTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_288.allowedTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_288.allowedTargets._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_288.allowedTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_288.allowedTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"sparseTextureClampARB",&local_2f9);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,", <LOD>",&local_2fa);
  SparseTexture2LookupTestCase::FunctionToken::FunctionToken(&local_2f8,&local_38,&local_58);
  SparseTexture2LookupTestCase::FunctionToken::operator=(&local_288,&local_2f8);
  SparseTexture2LookupTestCase::FunctionToken::~FunctionToken(&local_2f8);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  this_01 = &local_288.allowedTargets;
  local_2f8.name._M_dataplus._M_p._0_4_ = 0xde1;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
  _M_insert_unique<int>(&this_01->_M_t,(int *)&local_2f8);
  local_2f8.name._M_dataplus._M_p._0_4_ = 0x8c1a;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
  _M_insert_unique<int>(&this_01->_M_t,(int *)&local_2f8);
  local_2f8.name._M_dataplus._M_p._0_4_ = 0x8513;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
  _M_insert_unique<int>(&this_01->_M_t,(int *)&local_2f8);
  local_2f8.name._M_dataplus._M_p._0_4_ = 0x9009;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
  _M_insert_unique<int>(&this_01->_M_t,(int *)&local_2f8);
  local_2f8.name._M_dataplus._M_p._0_4_ = 0x806f;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
  _M_insert_unique<int>(&this_01->_M_t,(int *)&local_2f8);
  this_02 = &(this->super_SparseTextureClampLookupResidencyTestCase).
             super_SparseTexture2LookupTestCase.mFunctions;
  std::
  vector<gl4cts::SparseTexture2LookupTestCase::FunctionToken,_std::allocator<gl4cts::SparseTexture2LookupTestCase::FunctionToken>_>
  ::push_back(this_02,&local_288);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,"textureClampARB",&local_2f9);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,", <LOD>",&local_2fa);
  SparseTexture2LookupTestCase::FunctionToken::FunctionToken(&local_2f8,&local_78,&local_98);
  SparseTexture2LookupTestCase::FunctionToken::operator=(&local_288,&local_2f8);
  SparseTexture2LookupTestCase::FunctionToken::~FunctionToken(&local_2f8);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_78);
  local_2f8.name._M_dataplus._M_p._0_4_ = 0xde0;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
  _M_insert_unique<int>(&this_01->_M_t,(int *)&local_2f8);
  local_2f8.name._M_dataplus._M_p._0_4_ = 0x8c18;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
  _M_insert_unique<int>(&this_01->_M_t,(int *)&local_2f8);
  local_2f8.name._M_dataplus._M_p._0_4_ = 0xde1;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
  _M_insert_unique<int>(&this_01->_M_t,(int *)&local_2f8);
  local_2f8.name._M_dataplus._M_p._0_4_ = 0x8c1a;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
  _M_insert_unique<int>(&this_01->_M_t,(int *)&local_2f8);
  local_2f8.name._M_dataplus._M_p._0_4_ = 0x8513;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
  _M_insert_unique<int>(&this_01->_M_t,(int *)&local_2f8);
  local_2f8.name._M_dataplus._M_p._0_4_ = 0x9009;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
  _M_insert_unique<int>(&this_01->_M_t,(int *)&local_2f8);
  local_2f8.name._M_dataplus._M_p._0_4_ = 0x806f;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
  _M_insert_unique<int>(&this_01->_M_t,(int *)&local_2f8);
  std::
  vector<gl4cts::SparseTexture2LookupTestCase::FunctionToken,_std::allocator<gl4cts::SparseTexture2LookupTestCase::FunctionToken>_>
  ::push_back(this_02,&local_288);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b8,"sparseTextureOffsetClampARB",&local_2f9);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d8,", <OFFSET_TYPE><OFFSET_DIM>(0), <LOD>",&local_2fa);
  SparseTexture2LookupTestCase::FunctionToken::FunctionToken(&local_2f8,&local_b8,&local_d8);
  SparseTexture2LookupTestCase::FunctionToken::operator=(&local_288,&local_2f8);
  SparseTexture2LookupTestCase::FunctionToken::~FunctionToken(&local_2f8);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::~string((string *)&local_b8);
  local_2f8.name._M_dataplus._M_p._0_4_ = 0xde1;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
  _M_insert_unique<int>(&this_01->_M_t,(int *)&local_2f8);
  local_2f8.name._M_dataplus._M_p._0_4_ = 0x8c1a;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
  _M_insert_unique<int>(&this_01->_M_t,(int *)&local_2f8);
  local_2f8.name._M_dataplus._M_p._0_4_ = 0x806f;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
  _M_insert_unique<int>(&this_01->_M_t,(int *)&local_2f8);
  std::
  vector<gl4cts::SparseTexture2LookupTestCase::FunctionToken,_std::allocator<gl4cts::SparseTexture2LookupTestCase::FunctionToken>_>
  ::push_back(this_02,&local_288);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f8,"textureOffsetClampARB",&local_2f9);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_118,", <OFFSET_TYPE><OFFSET_DIM>(0), <LOD>",&local_2fa);
  SparseTexture2LookupTestCase::FunctionToken::FunctionToken(&local_2f8,&local_f8,&local_118);
  SparseTexture2LookupTestCase::FunctionToken::operator=(&local_288,&local_2f8);
  SparseTexture2LookupTestCase::FunctionToken::~FunctionToken(&local_2f8);
  std::__cxx11::string::~string((string *)&local_118);
  std::__cxx11::string::~string((string *)&local_f8);
  local_2f8.name._M_dataplus._M_p._0_4_ = 0xde0;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
  _M_insert_unique<int>(&this_01->_M_t,(int *)&local_2f8);
  local_2f8.name._M_dataplus._M_p._0_4_ = 0x8c18;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
  _M_insert_unique<int>(&this_01->_M_t,(int *)&local_2f8);
  local_2f8.name._M_dataplus._M_p._0_4_ = 0xde1;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
  _M_insert_unique<int>(&this_01->_M_t,(int *)&local_2f8);
  local_2f8.name._M_dataplus._M_p._0_4_ = 0x8c1a;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
  _M_insert_unique<int>(&this_01->_M_t,(int *)&local_2f8);
  local_2f8.name._M_dataplus._M_p._0_4_ = 0x806f;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
  _M_insert_unique<int>(&this_01->_M_t,(int *)&local_2f8);
  std::
  vector<gl4cts::SparseTexture2LookupTestCase::FunctionToken,_std::allocator<gl4cts::SparseTexture2LookupTestCase::FunctionToken>_>
  ::push_back(this_02,&local_288);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_138,"sparseTextureGradClampARB",&local_2f9);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_158,
             ", <NOFFSET_TYPE><OFFSET_DIM>(0), <NOFFSET_TYPE><OFFSET_DIM>(0), <LOD>",&local_2fa);
  SparseTexture2LookupTestCase::FunctionToken::FunctionToken(&local_2f8,&local_138,&local_158);
  SparseTexture2LookupTestCase::FunctionToken::operator=(&local_288,&local_2f8);
  SparseTexture2LookupTestCase::FunctionToken::~FunctionToken(&local_2f8);
  std::__cxx11::string::~string((string *)&local_158);
  std::__cxx11::string::~string((string *)&local_138);
  local_2f8.name._M_dataplus._M_p._0_4_ = 0xde1;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
  _M_insert_unique<int>(&this_01->_M_t,(int *)&local_2f8);
  local_2f8.name._M_dataplus._M_p._0_4_ = 0x8c1a;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
  _M_insert_unique<int>(&this_01->_M_t,(int *)&local_2f8);
  local_2f8.name._M_dataplus._M_p._0_4_ = 0x8513;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
  _M_insert_unique<int>(&this_01->_M_t,(int *)&local_2f8);
  local_2f8.name._M_dataplus._M_p._0_4_ = 0x9009;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
  _M_insert_unique<int>(&this_01->_M_t,(int *)&local_2f8);
  local_2f8.name._M_dataplus._M_p._0_4_ = 0x806f;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
  _M_insert_unique<int>(&this_01->_M_t,(int *)&local_2f8);
  std::
  vector<gl4cts::SparseTexture2LookupTestCase::FunctionToken,_std::allocator<gl4cts::SparseTexture2LookupTestCase::FunctionToken>_>
  ::push_back(this_02,&local_288);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_178,"textureGradClampARB",&local_2f9);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_198,
             ", <NOFFSET_TYPE><OFFSET_DIM>(0), <NOFFSET_TYPE><OFFSET_DIM>(0), <LOD>",&local_2fa);
  SparseTexture2LookupTestCase::FunctionToken::FunctionToken(&local_2f8,&local_178,&local_198);
  SparseTexture2LookupTestCase::FunctionToken::operator=(&local_288,&local_2f8);
  SparseTexture2LookupTestCase::FunctionToken::~FunctionToken(&local_2f8);
  std::__cxx11::string::~string((string *)&local_198);
  std::__cxx11::string::~string((string *)&local_178);
  local_2f8.name._M_dataplus._M_p._0_4_ = 0xde0;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
  _M_insert_unique<int>(&this_01->_M_t,(int *)&local_2f8);
  local_2f8.name._M_dataplus._M_p._0_4_ = 0x8c18;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
  _M_insert_unique<int>(&this_01->_M_t,(int *)&local_2f8);
  local_2f8.name._M_dataplus._M_p._0_4_ = 0xde1;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
  _M_insert_unique<int>(&this_01->_M_t,(int *)&local_2f8);
  local_2f8.name._M_dataplus._M_p._0_4_ = 0x8c1a;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
  _M_insert_unique<int>(&this_01->_M_t,(int *)&local_2f8);
  local_2f8.name._M_dataplus._M_p._0_4_ = 0x8513;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
  _M_insert_unique<int>(&this_01->_M_t,(int *)&local_2f8);
  local_2f8.name._M_dataplus._M_p._0_4_ = 0x9009;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
  _M_insert_unique<int>(&this_01->_M_t,(int *)&local_2f8);
  local_2f8.name._M_dataplus._M_p._0_4_ = 0x806f;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
  _M_insert_unique<int>(&this_01->_M_t,(int *)&local_2f8);
  std::
  vector<gl4cts::SparseTexture2LookupTestCase::FunctionToken,_std::allocator<gl4cts::SparseTexture2LookupTestCase::FunctionToken>_>
  ::push_back(this_02,&local_288);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1b8,"sparseTextureGradOffsetClampARB",&local_2f9);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1d8,
             ", <NOFFSET_TYPE><OFFSET_DIM>(0), <NOFFSET_TYPE><OFFSET_DIM>(0), <OFFSET_TYPE><OFFSET_DIM>(0), <LOD>"
             ,&local_2fa);
  SparseTexture2LookupTestCase::FunctionToken::FunctionToken(&local_2f8,&local_1b8,&local_1d8);
  SparseTexture2LookupTestCase::FunctionToken::operator=(&local_288,&local_2f8);
  SparseTexture2LookupTestCase::FunctionToken::~FunctionToken(&local_2f8);
  std::__cxx11::string::~string((string *)&local_1d8);
  std::__cxx11::string::~string((string *)&local_1b8);
  local_2f8.name._M_dataplus._M_p._0_4_ = 0xde1;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
  _M_insert_unique<int>(&this_01->_M_t,(int *)&local_2f8);
  local_2f8.name._M_dataplus._M_p._0_4_ = 0x8c1a;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
  _M_insert_unique<int>(&this_01->_M_t,(int *)&local_2f8);
  local_2f8.name._M_dataplus._M_p._0_4_ = 0x806f;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
  _M_insert_unique<int>(&this_01->_M_t,(int *)&local_2f8);
  std::
  vector<gl4cts::SparseTexture2LookupTestCase::FunctionToken,_std::allocator<gl4cts::SparseTexture2LookupTestCase::FunctionToken>_>
  ::push_back(this_02,&local_288);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1f8,"textureGradOffsetClampARB",&local_2f9);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_218,
             ", <NOFFSET_TYPE><OFFSET_DIM>(0), <NOFFSET_TYPE><OFFSET_DIM>(0), <OFFSET_TYPE><OFFSET_DIM>(0), <LOD>"
             ,&local_2fa);
  SparseTexture2LookupTestCase::FunctionToken::FunctionToken(&local_2f8,&local_1f8,&local_218);
  SparseTexture2LookupTestCase::FunctionToken::operator=(&local_288,&local_2f8);
  SparseTexture2LookupTestCase::FunctionToken::~FunctionToken(&local_2f8);
  std::__cxx11::string::~string((string *)&local_218);
  std::__cxx11::string::~string((string *)&local_1f8);
  local_2f8.name._M_dataplus._M_p._0_4_ = 0xde0;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
  _M_insert_unique<int>(&this_01->_M_t,(int *)&local_2f8);
  local_2f8.name._M_dataplus._M_p._0_4_ = 0x8c18;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
  _M_insert_unique<int>(&this_01->_M_t,(int *)&local_2f8);
  local_2f8.name._M_dataplus._M_p._0_4_ = 0xde1;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
  _M_insert_unique<int>(&this_01->_M_t,(int *)&local_2f8);
  local_2f8.name._M_dataplus._M_p._0_4_ = 0x8c1a;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
  _M_insert_unique<int>(&this_01->_M_t,(int *)&local_2f8);
  local_2f8.name._M_dataplus._M_p._0_4_ = 0x806f;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
  _M_insert_unique<int>(&this_01->_M_t,(int *)&local_2f8);
  std::
  vector<gl4cts::SparseTexture2LookupTestCase::FunctionToken,_std::allocator<gl4cts::SparseTexture2LookupTestCase::FunctionToken>_>
  ::push_back(this_02,&local_288);
  SparseTexture2LookupTestCase::FunctionToken::~FunctionToken(&local_288);
  return extraout_EAX;
}

Assistant:

void SparseTextureClampLookupColorTestCase::init()
{
	SparseTextureCommitmentTestCase::init();
	mSupportedTargets.push_back(GL_TEXTURE_1D);
	mSupportedTargets.push_back(GL_TEXTURE_1D_ARRAY);
	mSupportedInternalFormats.push_back(GL_DEPTH_COMPONENT16);

	FunctionToken f;
	f = FunctionToken("sparseTextureClampARB", ", <LOD>");
	f.allowedTargets.insert(GL_TEXTURE_2D);
	f.allowedTargets.insert(GL_TEXTURE_2D_ARRAY);
	f.allowedTargets.insert(GL_TEXTURE_CUBE_MAP);
	f.allowedTargets.insert(GL_TEXTURE_CUBE_MAP_ARRAY);
	f.allowedTargets.insert(GL_TEXTURE_3D);
	mFunctions.push_back(f);

	f = FunctionToken("textureClampARB", ", <LOD>");
	f.allowedTargets.insert(GL_TEXTURE_1D);
	f.allowedTargets.insert(GL_TEXTURE_1D_ARRAY);
	f.allowedTargets.insert(GL_TEXTURE_2D);
	f.allowedTargets.insert(GL_TEXTURE_2D_ARRAY);
	f.allowedTargets.insert(GL_TEXTURE_CUBE_MAP);
	f.allowedTargets.insert(GL_TEXTURE_CUBE_MAP_ARRAY);
	f.allowedTargets.insert(GL_TEXTURE_3D);
	mFunctions.push_back(f);

	f = FunctionToken("sparseTextureOffsetClampARB", ", <OFFSET_TYPE><OFFSET_DIM>(0), <LOD>");
	f.allowedTargets.insert(GL_TEXTURE_2D);
	f.allowedTargets.insert(GL_TEXTURE_2D_ARRAY);
	f.allowedTargets.insert(GL_TEXTURE_3D);
	mFunctions.push_back(f);

	f = FunctionToken("textureOffsetClampARB", ", <OFFSET_TYPE><OFFSET_DIM>(0), <LOD>");
	f.allowedTargets.insert(GL_TEXTURE_1D);
	f.allowedTargets.insert(GL_TEXTURE_1D_ARRAY);
	f.allowedTargets.insert(GL_TEXTURE_2D);
	f.allowedTargets.insert(GL_TEXTURE_2D_ARRAY);
	f.allowedTargets.insert(GL_TEXTURE_3D);
	mFunctions.push_back(f);

	f = FunctionToken("sparseTextureGradClampARB",
					  ", <NOFFSET_TYPE><OFFSET_DIM>(0), <NOFFSET_TYPE><OFFSET_DIM>(0), <LOD>");
	f.allowedTargets.insert(GL_TEXTURE_2D);
	f.allowedTargets.insert(GL_TEXTURE_2D_ARRAY);
	f.allowedTargets.insert(GL_TEXTURE_CUBE_MAP);
	f.allowedTargets.insert(GL_TEXTURE_CUBE_MAP_ARRAY);
	f.allowedTargets.insert(GL_TEXTURE_3D);
	mFunctions.push_back(f);

	f = FunctionToken("textureGradClampARB", ", <NOFFSET_TYPE><OFFSET_DIM>(0), <NOFFSET_TYPE><OFFSET_DIM>(0), <LOD>");
	f.allowedTargets.insert(GL_TEXTURE_1D);
	f.allowedTargets.insert(GL_TEXTURE_1D_ARRAY);
	f.allowedTargets.insert(GL_TEXTURE_2D);
	f.allowedTargets.insert(GL_TEXTURE_2D_ARRAY);
	f.allowedTargets.insert(GL_TEXTURE_CUBE_MAP);
	f.allowedTargets.insert(GL_TEXTURE_CUBE_MAP_ARRAY);
	f.allowedTargets.insert(GL_TEXTURE_3D);
	mFunctions.push_back(f);

	f = FunctionToken(
		"sparseTextureGradOffsetClampARB",
		", <NOFFSET_TYPE><OFFSET_DIM>(0), <NOFFSET_TYPE><OFFSET_DIM>(0), <OFFSET_TYPE><OFFSET_DIM>(0), <LOD>");
	f.allowedTargets.insert(GL_TEXTURE_2D);
	f.allowedTargets.insert(GL_TEXTURE_2D_ARRAY);
	f.allowedTargets.insert(GL_TEXTURE_3D);
	mFunctions.push_back(f);

	f = FunctionToken(
		"textureGradOffsetClampARB",
		", <NOFFSET_TYPE><OFFSET_DIM>(0), <NOFFSET_TYPE><OFFSET_DIM>(0), <OFFSET_TYPE><OFFSET_DIM>(0), <LOD>");
	f.allowedTargets.insert(GL_TEXTURE_1D);
	f.allowedTargets.insert(GL_TEXTURE_1D_ARRAY);
	f.allowedTargets.insert(GL_TEXTURE_2D);
	f.allowedTargets.insert(GL_TEXTURE_2D_ARRAY);
	f.allowedTargets.insert(GL_TEXTURE_3D);
	mFunctions.push_back(f);
}